

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O1

SUNErrCode SUNDataNode_CreateEmpty(SUNContext_conflict sunctx,SUNDataNode *node_out)

{
  SUNDataNode pSVar1;
  SUNDataNode_Ops pSVar2;
  
  pSVar1 = (SUNDataNode)malloc(0x20);
  pSVar2 = (SUNDataNode_Ops)malloc(0x78);
  pSVar2->getchild = (_func_SUNErrCode_SUNDataNode_sundataindex_SUNDataNode_ptr *)0x0;
  pSVar2->removechild = (_func_SUNErrCode_SUNDataNode_sundataindex_SUNDataNode_ptr *)0x0;
  pSVar2->getdata = (_func_SUNErrCode_SUNDataNode_void_ptr_ptr_size_t_ptr_size_t_ptr *)0x0;
  pSVar2->setdata =
       (_func_SUNErrCode_SUNDataNode_SUNMemoryType_SUNMemoryType_void_ptr_size_t_size_t *)0x0;
  pSVar2->destroy = (_func_SUNErrCode_SUNDataNode_ptr *)0x0;
  pSVar2->haschildren = (_func_SUNErrCode_SUNDataNode_int_ptr *)0x0;
  pSVar2->isleaf = (_func_SUNErrCode_SUNDataNode_int_ptr *)0x0;
  pSVar2->islist = (_func_SUNErrCode_SUNDataNode_int_ptr *)0x0;
  pSVar2->isobject = (_func_SUNErrCode_SUNDataNode_int_ptr *)0x0;
  pSVar2->addchild = (_func_SUNErrCode_SUNDataNode_SUNDataNode *)0x0;
  pSVar1->dtype = SUNDATANODE_LEAF;
  pSVar1->ops = pSVar2;
  pSVar1->content = (void *)0x0;
  pSVar1->sunctx = sunctx;
  *node_out = pSVar1;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_CreateEmpty(SUNContext sunctx, SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDataNode self;
  self = (SUNDataNode)malloc(sizeof(*self));
  SUNAssert(self, SUN_ERR_MEM_FAIL);

  SUNDataNode_Ops ops;
  ops = (SUNDataNode_Ops)malloc(sizeof(*ops));
  SUNAssert(self, SUN_ERR_MEM_FAIL);

  ops->haschildren = NULL;
  ops->isleaf      = NULL;
  ops->islist      = NULL;
  ops->isobject    = NULL;
  ops->addchild    = NULL;
  ops->getchild    = NULL;
  ops->removechild = NULL;
  ops->getdata     = NULL;
  ops->setdata     = NULL;
  ops->destroy     = NULL;

  self->dtype   = 0;
  self->ops     = ops;
  self->content = NULL;
  self->sunctx  = sunctx;

  *node_out = self;
  return SUN_SUCCESS;
}